

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O2

void __thiscall CP::vector<int>::uniq(vector<int> *this)

{
  int *piVar1;
  ulong uVar2;
  size_t sVar3;
  iterator iVar4;
  int *__tmp;
  long lVar5;
  int i;
  ulong uVar6;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> s;
  vector<int> local_78;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  vector(&local_78);
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    piVar1 = this->mData;
    uVar2 = this->mSize;
    if (uVar2 <= uVar6) break;
    iVar4 = std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&local_60,(key_type *)((long)piVar1 + lVar5));
    if (iVar4.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
      std::__detail::
      _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_60,(value_type *)((long)this->mData + lVar5));
      push_back(&local_78,(int *)((long)this->mData + lVar5));
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 4;
  }
  this->mData = local_78.mData;
  sVar3 = this->mCap;
  this->mCap = local_78.mCap;
  this->mSize = local_78.mSize;
  local_78.mData = piVar1;
  local_78.mCap = sVar3;
  local_78.mSize = uVar2;
  ~vector(&local_78);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  return;
}

Assistant:

void CP::vector<T>::uniq() {
  //do someting here
  std::unordered_set<T> s;
  CP::vector<T> tmp;
  for (int i = 0; i < mSize; ++i) {
    if (s.find(mData[i]) == s.end()) {
      s.insert(mData[i]);
      tmp.push_back(mData[i]);
    }
  }
  std::swap(mData, tmp.mData);
  std::swap(mSize, tmp.mSize);
  std::swap(mCap, tmp.mCap);
}